

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O1

Material * __thiscall Assimp::ASE::Material::operator=(Material *this,Material *other)

{
  if (this != other) {
    D3DS::Material::operator=(&this->super_Material,&other->super_Material);
    std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::_M_move_assign
              (&this->avSubMaterials,&other->avSubMaterials);
    this->pcInstance = other->pcInstance;
    this->bNeed = other->bNeed;
    other->pcInstance = (aiMaterial *)0x0;
  }
  return this;
}

Assistant:

Material &operator=(Material &&other) AI_NO_EXCEPT {
        if (this == &other) {
            return *this;
        }

        D3DS::Material::operator=(std::move(other));

        avSubMaterials = std::move(other.avSubMaterials);
        pcInstance = std::move(other.pcInstance);
        bNeed = std::move(other.bNeed);

        other.pcInstance = nullptr;

        return *this;
    }